

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O2

u32string * __thiscall
peg::decode_abi_cxx11_(u32string *__return_storage_ptr__,peg *this,char *s8,size_t l)

{
  char32_t __c;
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  pcVar1 = (char *)0x0;
  while (pcVar1 < s8) {
    pcVar2 = s8;
    if (pcVar1 + 1 < s8) {
      pcVar2 = pcVar1 + 1;
    }
    __c = decode_codepoint((char *)(this + (long)pcVar1),(long)pcVar2 - (long)pcVar1);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    push_back(__return_storage_ptr__,__c);
    pcVar1 = pcVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::u32string decode(const char *s8, size_t l) {
  std::u32string out;
  size_t i = 0;
  while (i < l) {
    auto beg = i++;
    while (i < l && (s8[i] & 0xc0) == 0x80) {
      i++;
    }
    out += decode_codepoint(&s8[beg], (i - beg));
  }
  return out;
}